

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_vector_unittest.cpp
# Opt level: O2

void __thiscall HostVector_copy_Test::TestBody(HostVector_copy_Test *this)

{
  pointer pvVar1;
  char *message;
  long lVar2;
  long lVar3;
  value_type_conflict2 v;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  AssertionResult gtest_ar;
  AssertHelper local_78;
  vecN<float,_32> v32;
  vecN<float,_16> v16;
  
  memory::
  Array<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<16ul>>>>
  ::Array<int,void>((Array<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<16ul>>>>
                     *)&v16,100);
  v32.
  super_ArrayView<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<32UL>_>_>_>
  .pointer_ = v16.
              super_ArrayView<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>
              .pointer_;
  v32.
  super_ArrayView<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<32UL>_>_>_>
  .size_ = v16.
           super_ArrayView<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>
           .size_;
  memory::
  ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>
  ::operator=((ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>
               *)&v32,3.14);
  memory::
  Array<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<32ul>>>>
  ::
  Array<memory::Array<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<16ul>>>>&,void>
            ((Array<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<32ul>>>>
              *)&v32,&v16);
  pvVar1 = v32.
           super_ArrayView<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<32UL>_>_>_>
           .pointer_;
  lVar3 = v32.
          super_ArrayView<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<32UL>_>_>_>
          .size_ << 2;
  for (lVar2 = 0; lVar3 != lVar2; lVar2 = lVar2 + 4) {
    v = *(value_type_conflict2 *)((long)pvVar1 + lVar2);
    local_90.ptr_._0_4_ = 0x4048f5c3;
    testing::internal::CmpHelperEQ<float,float>
              ((internal *)&gtest_ar,"v","3.14f",&v,(float *)&local_90);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_90);
      message = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/host_vector_unittest.cpp"
                 ,0x61,message);
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_90);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  memory::
  Array<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<32UL>_>_>_>
  ::~Array(&v32);
  memory::
  Array<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>
  ::~Array(&v16);
  return;
}

Assistant:

TEST(HostVector, copy) {
    using namespace memory;

    vecN<float, 16> v16(100);
    v16(memory::all) = 3.14f;
    vecN<float, 32> v32 = v16;

    for(auto v: v32) {
        EXPECT_EQ(v, 3.14f);
    }
}